

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::ChContactTriangleXYZ(ChContactTriangleXYZ *this,void **vtt)

{
  ChLoadableUV CVar1;
  _func_int **pp_Var2;
  ChCollisionModelBullet *this_00;
  undefined1 auVar3 [32];
  
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable._vptr_ChContactable =
       (_func_int **)&PTR__ChContactable_3vars_00b2a4d8;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChVariableTupleCarrier_3vars<3,_3,_3>.
  _vptr_ChVariableTupleCarrier_3vars = (_func_int **)&PTR__ChContactable_3vars_00b2a580;
  CVar1 = *(ChLoadableUV *)(vtt + 1);
  this->super_ChLoadableUV = CVar1;
  *(void **)(&(this->super_ChLoadableUV).field_0x0 + *(long *)((long)CVar1 + -0x78)) = vtt[2];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable._vptr_ChContactable = pp_Var2;
  (this->super_ChContactable_3vars<3,_3,_3>).super_ChVariableTupleCarrier_3vars<3,_3,_3>.
  _vptr_ChVariableTupleCarrier_3vars = (_func_int **)(vtable + 0x148);
  this->super_ChLoadableUV = *(ChLoadableUV *)(vtt + 3);
  *(void **)((long)&(this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.
                    _vptr_ChContactable + (long)pp_Var2[-3]) = vtt[4];
  auVar3 = ZEXT432(0) << 0x40;
  this->mnode2 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar3._0_16_;
  this->mnode3 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar3._16_16_;
  this->mnode1 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar3._0_16_;
  this->mnode2 = (shared_ptr<chrono::fea::ChNodeFEAxyz>)auVar3._16_16_;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])(this_00,this);
  return;
}

Assistant:

ChContactTriangleXYZ::ChContactTriangleXYZ() {
    collision_model = new collision::ChCollisionModelBullet;
    collision_model->SetContactable(this);
}